

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

Parser * Catch::makeCommandLineParser(ConfigData *config)

{
  Opt *other;
  Arg *this;
  Opt *this_00;
  long in_RSI;
  Parser *in_RDI;
  anon_class_8_1_50637480_for_m_lambda setReporter;
  anon_class_8_1_50637480_for_m_lambda setVerbosity;
  anon_class_8_1_50637480_for_m_lambda setWaitForKeypress;
  anon_class_8_1_50637480_for_m_lambda setColourUsage;
  anon_class_8_1_50637480_for_m_lambda setRngSeed;
  anon_class_8_1_50637480_for_m_lambda setTestOrder;
  anon_class_8_1_50637480_for_m_lambda loadTestNamesFromFile;
  anon_class_8_1_50637480_for_m_lambda setWarning;
  Parser *cli;
  string *in_stack_ffffffffffffcf98;
  Opt *in_stack_ffffffffffffcfa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffcfa8;
  allocator *paVar1;
  Opt *in_stack_ffffffffffffcfb0;
  string *in_stack_ffffffffffffcfb8;
  Opt *in_stack_ffffffffffffcfc0;
  Opt *in_stack_ffffffffffffd030;
  Parser *in_stack_ffffffffffffd038;
  Parser *this_01;
  Help *in_stack_ffffffffffffd080;
  ComposableParserImpl<Catch::clara::detail::ExeName> *in_stack_ffffffffffffd088;
  bool *in_stack_ffffffffffffd098;
  Help *in_stack_ffffffffffffd0a0;
  allocator local_2a79;
  string local_2a78 [39];
  allocator local_2a51;
  string local_2a50 [135];
  allocator local_29c9;
  string local_29c8 [39];
  allocator local_29a1;
  string local_29a0 [39];
  allocator local_2979;
  string local_2978 [159];
  allocator local_28d9;
  string local_28d8 [39];
  allocator local_28b1;
  string local_28b0 [159];
  allocator local_2811;
  string local_2810 [39];
  allocator local_27e9;
  string local_27e8 [39];
  undefined1 local_27c1 [160];
  allocator local_2721;
  string local_2720 [39];
  allocator local_26f9;
  string local_26f8 [39];
  allocator local_26d1;
  string local_26d0 [159];
  allocator local_2631;
  string local_2630 [39];
  allocator local_2609;
  string local_2608 [39];
  allocator local_25e1;
  string local_25e0 [159];
  allocator local_2541;
  string local_2540 [39];
  allocator local_2519;
  string local_2518 [39];
  allocator local_24f1;
  string local_24f0 [159];
  allocator local_2451;
  string local_2450 [39];
  allocator local_2429;
  string local_2428 [159];
  allocator local_2389;
  string local_2388 [39];
  allocator local_2361;
  string local_2360 [39];
  allocator local_2339;
  string local_2338 [159];
  allocator local_2299;
  string local_2298 [39];
  allocator local_2271;
  string local_2270 [39];
  allocator local_2249;
  string local_2248 [159];
  allocator local_21a9;
  string local_21a8 [39];
  allocator local_2181;
  string local_2180 [39];
  allocator local_2159;
  string local_2158 [159];
  allocator local_20b9;
  string local_20b8 [39];
  allocator local_2091;
  string local_2090 [159];
  allocator local_1ff1;
  string local_1ff0 [39];
  allocator local_1fc9;
  string local_1fc8 [159];
  allocator local_1f29;
  string local_1f28 [39];
  allocator local_1f01;
  string local_1f00 [39];
  allocator local_1ed9;
  string local_1ed8 [39];
  allocator local_1eb1;
  string local_1eb0 [159];
  allocator local_1e11;
  string local_1e10 [39];
  allocator local_1de9;
  string local_1de8 [39];
  allocator local_1dc1;
  string local_1dc0 [39];
  allocator local_1d99;
  string local_1d98 [159];
  allocator local_1cf9;
  string local_1cf8 [39];
  allocator local_1cd1;
  string local_1cd0 [39];
  allocator local_1ca9;
  string local_1ca8 [159];
  allocator local_1c09;
  string local_1c08 [39];
  allocator local_1be1;
  string local_1be0 [39];
  allocator local_1bb9;
  string local_1bb8 [39];
  allocator local_1b91;
  string local_1b90 [159];
  allocator local_1af1;
  string local_1af0 [39];
  allocator local_1ac9;
  string local_1ac8 [39];
  allocator local_1aa1;
  string local_1aa0 [39];
  allocator local_1a79;
  string local_1a78 [159];
  allocator local_19d9;
  string local_19d8 [39];
  allocator local_19b1;
  string local_19b0 [39];
  allocator local_1989;
  string local_1988 [39];
  allocator local_1961;
  string local_1960 [32];
  long local_1940;
  allocator local_18b9;
  string local_18b8 [39];
  allocator local_1891;
  string local_1890 [39];
  allocator local_1869;
  string local_1868 [39];
  allocator local_1841;
  string local_1840 [159];
  allocator local_17a1;
  string local_17a0 [39];
  allocator local_1779;
  string local_1778 [39];
  allocator local_1751;
  string local_1750 [39];
  allocator local_1729;
  string local_1728 [32];
  long local_1708;
  allocator local_1681;
  string local_1680 [39];
  allocator local_1659;
  string local_1658 [39];
  allocator local_1631;
  string local_1630 [32];
  long local_1610;
  allocator local_1589;
  string local_1588 [39];
  allocator local_1561;
  string local_1560 [39];
  allocator local_1539;
  string local_1538 [39];
  allocator local_1511;
  string local_1510 [159];
  allocator local_1471;
  string local_1470 [39];
  allocator local_1449;
  string local_1448 [39];
  allocator local_1421;
  string local_1420 [39];
  allocator local_13f9;
  string local_13f8 [159];
  allocator local_1359;
  string local_1358 [39];
  allocator local_1331;
  string local_1330 [39];
  allocator local_1309;
  string local_1308 [39];
  allocator local_12e1;
  string local_12e0 [159];
  allocator local_1241;
  string local_1240 [39];
  allocator local_1219;
  string local_1218 [39];
  allocator local_11f1;
  string local_11f0 [159];
  allocator local_1151;
  string local_1150 [39];
  allocator local_1129;
  string local_1128 [39];
  allocator local_1101;
  string local_1100 [159];
  allocator local_1061;
  string local_1060 [39];
  allocator local_1039;
  string local_1038 [39];
  allocator local_1011;
  string local_1010 [159];
  allocator local_f71;
  string local_f70 [39];
  allocator local_f49;
  string local_f48 [39];
  allocator local_f21;
  string local_f20 [159];
  allocator local_e81;
  string local_e80 [39];
  allocator local_e59;
  string local_e58 [39];
  allocator local_e31;
  string local_e30 [159];
  allocator local_d91;
  string local_d90 [39];
  allocator local_d69;
  string local_d68 [39];
  allocator local_d41;
  string local_d40 [3311];
  undefined1 local_51;
  long local_10;
  
  local_51 = 0;
  local_10 = in_RSI;
  clara::detail::ExeName::ExeName((ExeName *)in_stack_ffffffffffffcfc0,in_stack_ffffffffffffcfb8);
  clara::detail::Help::Help(in_stack_ffffffffffffd0a0,in_stack_ffffffffffffd098);
  clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
            (in_stack_ffffffffffffd088,in_stack_ffffffffffffd080);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d40,"-l",&local_d41);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d68,"--list-tests",&local_d69);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d90,"list all/matching test cases",&local_d91);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e30,"-t",&local_e31);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e58,"--list-tags",&local_e59);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e80,"list all/matching tags",&local_e81);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f20,"-s",&local_f21);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f48,"--success",&local_f49);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f70,"include successful tests in output",&local_f71);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1010,"-b",&local_1011);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1038,"--break",&local_1039);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1060,"break into debugger on failure",&local_1061);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1100,"-e",&local_1101);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1128,"--nothrow",&local_1129);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1150,"skip exception tests",&local_1151);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11f0,"-i",&local_11f1);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1218,"--invisibles",&local_1219);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1240,"show invisibles (tabs, newlines)",&local_1241);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12e0,"filename",&local_12e1);
  clara::detail::Opt::Opt<std::__cxx11::string>
            (in_stack_ffffffffffffcfb0,in_stack_ffffffffffffcfa8,(string *)in_stack_ffffffffffffcfa0
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1308,"-o",&local_1309);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1330,"--out",&local_1331);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1358,"output filename",&local_1359);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13f8,"name",&local_13f9);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__0>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1420,"-r",&local_1421);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1448,"--reporter",&local_1449);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1470,"reporter to use (defaults to console)",&local_1471);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1510,"name",&local_1511);
  clara::detail::Opt::Opt<std::__cxx11::string>
            (in_stack_ffffffffffffcfb0,in_stack_ffffffffffffcfa8,(string *)in_stack_ffffffffffffcfa0
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1538,"-n",&local_1539);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1560,"--name",&local_1561);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1588,"suite name",&local_1589);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  local_1610 = local_10;
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__1>
            (in_stack_ffffffffffffcfc0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1630,"-a",&local_1631);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1658,"--abort",&local_1659);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1680,"abort at first failure",&local_1681);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  local_1708 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1728,"no. failures",&local_1729);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__2>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1750,"-x",&local_1751);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1778,"--abortx",&local_1779);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17a0,"abort after x failures",&local_17a1);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1840,"warning name",&local_1841);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__3>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1868,"-w",&local_1869);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1890,"--warn",&local_1891);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18b8,"enable warnings",&local_18b9);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  local_1940 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1960,"yes|no",&local_1961);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__4>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1988,"-d",&local_1989);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19b0,"--durations",&local_19b1);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19d8,"show test durations",&local_19d9);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a78,"seconds",&local_1a79);
  clara::detail::Opt::Opt<double>
            (in_stack_ffffffffffffcfb0,(double *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1aa0,"-D",&local_1aa1);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ac8,"--min-duration",&local_1ac9);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1af0,"show test durations for tests taking at least the given number of seconds",
             &local_1af1);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b90,"filename",&local_1b91);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__5>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1bb8,"-f",&local_1bb9);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1be0,"--input-file",&local_1be1);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c08,"load test names to run from a file",&local_1c09);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ca8,"-#",&local_1ca9);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1cd0,"--filenames-as-tags",&local_1cd1);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1cf8,"adds a tag for the filename",&local_1cf9);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d98,"section name",&local_1d99);
  clara::detail::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffcfb0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffcfa8,(string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1dc0,"-c",&local_1dc1);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1de8,"--section",&local_1de9);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e10,"specify section to run",&local_1e11);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1eb0,"quiet|normal|high",&local_1eb1);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__6>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ed8,"-v",&local_1ed9);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f00,"--verbosity",&local_1f01);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f28,"set output verbosity",&local_1f29);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1fc8,"--list-test-names-only",&local_1fc9);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ff0,"list all/matching test cases names only",&local_1ff1);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2090,"--list-reporters",&local_2091);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20b8,"list all reporters",&local_20b9);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2158,"decl|lex|rand",&local_2159);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__7>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2180,"--order",&local_2181);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_21a8,"test case order (defaults to decl)",&local_21a9);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2248,"\'time\'|number",&local_2249);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__8>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2270,"--rng-seed",&local_2271);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2298,"set a specific seed for random numbers",&local_2299);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2338,"yes|no",&local_2339);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__9>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2360,"--use-colour",&local_2361);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2388,"should output be colourised",&local_2389);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2428,"--libidentify",&local_2429);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2450,"report name and version according to libidentify standard",&local_2451);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_24f0,"never|start|exit|both",&local_24f1);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__10>
            (in_stack_ffffffffffffcfb0,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2518,"--wait-for-keypress",&local_2519);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2540,"waits for a keypress before exiting",&local_2541);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  paVar1 = &local_25e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_25e0,"samples",paVar1);
  clara::detail::Opt::Opt<unsigned_int>
            (in_stack_ffffffffffffcfb0,(uint *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  paVar1 = &local_2609;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2608,"--benchmark-samples",paVar1);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2630,"number of samples to collect (default: 100)",&local_2631)
  ;
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_26d0,"resamples",&local_26d1);
  clara::detail::Opt::Opt<unsigned_int>
            (in_stack_ffffffffffffcfb0,(uint *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_26f8,"--benchmark-resamples",&local_26f9);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2720,"number of resamples for the bootstrap (default: 100000)",&local_2721);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd038,in_stack_ffffffffffffd030);
  other = (Opt *)(local_10 + 0x20);
  this_01 = (Parser *)local_27c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_27c1 + 1),"confidence interval",(allocator *)this_01);
  clara::detail::Opt::Opt<double>
            (in_stack_ffffffffffffcfb0,(double *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_27e8,"--benchmark-confidence-interval",&local_27e9);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2810,"confidence interval for the bootstrap (between 0 and 1, default: 0.95)",
             &local_2811);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(this_01,other);
  clara::detail::Opt::Opt(in_stack_ffffffffffffcfc0,(bool *)in_stack_ffffffffffffcfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28b0,"--benchmark-no-analysis",&local_28b1);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28d8,"perform only measurements; do not perform any analysis",&local_28d9);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(this_01,other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2978,"benchmarkWarmupTime",&local_2979);
  clara::detail::Opt::Opt<long>
            (in_stack_ffffffffffffcfb0,(long *)in_stack_ffffffffffffcfa8,
             (string *)in_stack_ffffffffffffcfa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_29a0,"--benchmark-warmup-time",&local_29a1);
  clara::detail::Opt::operator[](in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_29c8,
             "amount of time in milliseconds spent on warming up each test (default: 100)",
             &local_29c9);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffcfa0->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(this_01,other);
  this = (Arg *)(local_10 + 0xe0);
  paVar1 = &local_2a51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a50,"test name|pattern|tags",paVar1);
  clara::detail::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>>
            (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffcfa8,(string *)in_stack_ffffffffffffcfa0);
  paVar1 = &local_2a79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a78,"which test or tests to use",paVar1);
  this_00 = (Opt *)clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::operator()
                             ((ParserRefImpl<Catch::clara::detail::Arg> *)in_stack_ffffffffffffcfa0,
                              in_stack_ffffffffffffcf98);
  clara::detail::Parser::operator|(this_01,(Arg *)other);
  std::__cxx11::string::~string(local_2a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a79);
  clara::detail::Arg::~Arg((Arg *)0x11c27d);
  std::__cxx11::string::~string(local_2a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a51);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_29c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_29c9);
  std::__cxx11::string::~string(local_29a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_29a1);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_2978);
  std::allocator<char>::~allocator((allocator<char> *)&local_2979);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_28d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_28d9);
  std::__cxx11::string::~string(local_28b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_28b1);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_2810);
  std::allocator<char>::~allocator((allocator<char> *)&local_2811);
  std::__cxx11::string::~string(local_27e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27e9);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string((string *)(local_27c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_27c1);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_2720);
  std::allocator<char>::~allocator((allocator<char> *)&local_2721);
  std::__cxx11::string::~string(local_26f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_26f9);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_26d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_26d1);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_2630);
  std::allocator<char>::~allocator((allocator<char> *)&local_2631);
  std::__cxx11::string::~string(local_2608);
  std::allocator<char>::~allocator((allocator<char> *)&local_2609);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_25e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_25e1);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_2540);
  std::allocator<char>::~allocator((allocator<char> *)&local_2541);
  std::__cxx11::string::~string(local_2518);
  std::allocator<char>::~allocator((allocator<char> *)&local_2519);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_24f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_24f1);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_2450);
  std::allocator<char>::~allocator((allocator<char> *)&local_2451);
  std::__cxx11::string::~string(local_2428);
  std::allocator<char>::~allocator((allocator<char> *)&local_2429);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_2388);
  std::allocator<char>::~allocator((allocator<char> *)&local_2389);
  std::__cxx11::string::~string(local_2360);
  std::allocator<char>::~allocator((allocator<char> *)&local_2361);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_2338);
  std::allocator<char>::~allocator((allocator<char> *)&local_2339);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_2298);
  std::allocator<char>::~allocator((allocator<char> *)&local_2299);
  std::__cxx11::string::~string(local_2270);
  std::allocator<char>::~allocator((allocator<char> *)&local_2271);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_2248);
  std::allocator<char>::~allocator((allocator<char> *)&local_2249);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_21a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_21a9);
  std::__cxx11::string::~string(local_2180);
  std::allocator<char>::~allocator((allocator<char> *)&local_2181);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_2158);
  std::allocator<char>::~allocator((allocator<char> *)&local_2159);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_20b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_20b9);
  std::__cxx11::string::~string(local_2090);
  std::allocator<char>::~allocator((allocator<char> *)&local_2091);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1ff0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ff1);
  std::__cxx11::string::~string(local_1fc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fc9);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1f28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f29);
  std::__cxx11::string::~string(local_1f00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f01);
  std::__cxx11::string::~string(local_1ed8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ed9);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_1eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1eb1);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1e10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e11);
  std::__cxx11::string::~string(local_1de8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1de9);
  std::__cxx11::string::~string(local_1dc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dc1);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_1d98);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d99);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1cf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cf9);
  std::__cxx11::string::~string(local_1cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cd1);
  std::__cxx11::string::~string(local_1ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ca9);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1c08);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c09);
  std::__cxx11::string::~string(local_1be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1be1);
  std::__cxx11::string::~string(local_1bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bb9);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_1b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b91);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1af1);
  std::__cxx11::string::~string(local_1ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ac9);
  std::__cxx11::string::~string(local_1aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1aa1);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_1a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a79);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_19d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19d9);
  std::__cxx11::string::~string(local_19b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19b1);
  std::__cxx11::string::~string(local_1988);
  std::allocator<char>::~allocator((allocator<char> *)&local_1989);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_1960);
  std::allocator<char>::~allocator((allocator<char> *)&local_1961);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_18b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18b9);
  std::__cxx11::string::~string(local_1890);
  std::allocator<char>::~allocator((allocator<char> *)&local_1891);
  std::__cxx11::string::~string(local_1868);
  std::allocator<char>::~allocator((allocator<char> *)&local_1869);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_1840);
  std::allocator<char>::~allocator((allocator<char> *)&local_1841);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_17a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17a1);
  std::__cxx11::string::~string(local_1778);
  std::allocator<char>::~allocator((allocator<char> *)&local_1779);
  std::__cxx11::string::~string(local_1750);
  std::allocator<char>::~allocator((allocator<char> *)&local_1751);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_1728);
  std::allocator<char>::~allocator((allocator<char> *)&local_1729);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1680);
  std::allocator<char>::~allocator((allocator<char> *)&local_1681);
  std::__cxx11::string::~string(local_1658);
  std::allocator<char>::~allocator((allocator<char> *)&local_1659);
  std::__cxx11::string::~string(local_1630);
  std::allocator<char>::~allocator((allocator<char> *)&local_1631);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1588);
  std::allocator<char>::~allocator((allocator<char> *)&local_1589);
  std::__cxx11::string::~string(local_1560);
  std::allocator<char>::~allocator((allocator<char> *)&local_1561);
  std::__cxx11::string::~string(local_1538);
  std::allocator<char>::~allocator((allocator<char> *)&local_1539);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_1510);
  std::allocator<char>::~allocator((allocator<char> *)&local_1511);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1470);
  std::allocator<char>::~allocator((allocator<char> *)&local_1471);
  std::__cxx11::string::~string(local_1448);
  std::allocator<char>::~allocator((allocator<char> *)&local_1449);
  std::__cxx11::string::~string(local_1420);
  std::allocator<char>::~allocator((allocator<char> *)&local_1421);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_13f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13f9);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1358);
  std::allocator<char>::~allocator((allocator<char> *)&local_1359);
  std::__cxx11::string::~string(local_1330);
  std::allocator<char>::~allocator((allocator<char> *)&local_1331);
  std::__cxx11::string::~string(local_1308);
  std::allocator<char>::~allocator((allocator<char> *)&local_1309);
  clara::detail::Opt::~Opt(this_00);
  std::__cxx11::string::~string(local_12e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12e1);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1240);
  std::allocator<char>::~allocator((allocator<char> *)&local_1241);
  std::__cxx11::string::~string(local_1218);
  std::allocator<char>::~allocator((allocator<char> *)&local_1219);
  std::__cxx11::string::~string(local_11f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11f1);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1150);
  std::allocator<char>::~allocator((allocator<char> *)&local_1151);
  std::__cxx11::string::~string(local_1128);
  std::allocator<char>::~allocator((allocator<char> *)&local_1129);
  std::__cxx11::string::~string(local_1100);
  std::allocator<char>::~allocator((allocator<char> *)&local_1101);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_1060);
  std::allocator<char>::~allocator((allocator<char> *)&local_1061);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  std::__cxx11::string::~string(local_1010);
  std::allocator<char>::~allocator((allocator<char> *)&local_1011);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_f70);
  std::allocator<char>::~allocator((allocator<char> *)&local_f71);
  std::__cxx11::string::~string(local_f48);
  std::allocator<char>::~allocator((allocator<char> *)&local_f49);
  std::__cxx11::string::~string(local_f20);
  std::allocator<char>::~allocator((allocator<char> *)&local_f21);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_e80);
  std::allocator<char>::~allocator((allocator<char> *)&local_e81);
  std::__cxx11::string::~string(local_e58);
  std::allocator<char>::~allocator((allocator<char> *)&local_e59);
  std::__cxx11::string::~string(local_e30);
  std::allocator<char>::~allocator((allocator<char> *)&local_e31);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  std::__cxx11::string::~string(local_d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  std::__cxx11::string::~string(local_d40);
  std::allocator<char>::~allocator((allocator<char> *)&local_d41);
  clara::detail::Opt::~Opt(this_00);
  clara::detail::Parser::~Parser((Parser *)this_00);
  clara::detail::Help::~Help((Help *)0x11cf7d);
  clara::detail::ExeName::~ExeName((ExeName *)this_00);
  return in_RDI;
}

Assistant:

clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace clara;

        auto const setWarning = [&]( std::string const& warning ) {
                auto warningSet = [&]() {
                    if( warning == "NoAssertions" )
                        return WarnAbout::NoAssertions;

                    if ( warning == "NoTests" )
                        return WarnAbout::NoTests;

                    return WarnAbout::Nothing;
                }();

                if (warningSet == WarnAbout::Nothing)
                    return ParserResult::runtimeError( "Unrecognised warning: '" + warning + "'" );
                config.warnings = static_cast<WarnAbout::What>( config.warnings | warningSet );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + "'" );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + line + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = RunTests::InDeclarationOrder;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = RunTests::InLexicographicalOrder;
                else if( startsWith( "random", order ) )
                    config.runOrder = RunTests::InRandomOrder;
                else
                    return clara::ParserResult::runtimeError( "Unrecognised ordering: '" + order + "'" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed != "time" )
                    return clara::detail::convertInto( seed, config.rngSeed );
                config.rngSeed = static_cast<unsigned int>( std::time(nullptr) );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setColourUsage = [&]( std::string const& useColour ) {
                    auto mode = toLower( useColour );

                    if( mode == "yes" )
                        config.useColour = UseColour::Yes;
                    else if( mode == "no" )
                        config.useColour = UseColour::No;
                    else if( mode == "auto" )
                        config.useColour = UseColour::Auto;
                    else
                        return ParserResult::runtimeError( "colour mode must be one of: auto, yes or no. '" + useColour + "' not recognised" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + "'" );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& reporter ) {
            IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();

            auto lcReporter = toLower( reporter );
            auto result = factories.find( lcReporter );

            if( factories.end() != result )
                config.reporterName = lcReporter;
            else
                return ParserResult::runtimeError( "Unrecognized reporter, '" + reporter + "'. Check available with --list-reporters" );
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.listTests )
                ["-l"]["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["-t"]["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.outputFilename, "filename" )
                ["-o"]["--out"]
                ( "output filename" )
            | Opt( setReporter, "name" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTestNamesOnly )
                ["--list-test-names-only"]
                ( "list all/matching test cases names only" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all reporters" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setColourUsage, "yes|no" )
                ["--use-colour"]
                ( "should output be colourised" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }